

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Cluster * __thiscall mkvparser::Segment::FindCluster(Segment *this,longlong time_ns)

{
  Cluster *this_00;
  longlong lVar1;
  long lVar2;
  Cluster *pCluster;
  long k;
  longlong t;
  Cluster *pCluster_2;
  long k_1;
  long j;
  long i;
  Cluster *pCluster_1;
  longlong time_ns_local;
  Segment *this_local;
  
  if ((this->m_clusters == (Cluster **)0x0) || (this->m_clusterCount < 1)) {
    this_local = (Segment *)&this->m_eos;
  }
  else {
    this_local = (Segment *)*this->m_clusters;
    if (this_local == (Segment *)0x0) {
      __assert_fail("pCluster",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xc64,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
    }
    if (this_local->m_start != 0) {
      __assert_fail("pCluster->m_index == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xc65,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
    }
    lVar1 = Cluster::GetTime((Cluster *)this_local);
    if (lVar1 < time_ns) {
      j = 0;
      k_1 = this->m_clusterCount;
      while (j < k_1) {
        lVar2 = j + (k_1 - j) / 2;
        if (this->m_clusterCount <= lVar2) {
          __assert_fail("k < m_clusterCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xc77,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
        }
        this_00 = this->m_clusters[lVar2];
        if (this_00 == (Cluster *)0x0) {
          __assert_fail("pCluster",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xc7a,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
        }
        if (this_00->m_index != lVar2) {
          __assert_fail("pCluster->m_index == k",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xc7b,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
        }
        lVar1 = Cluster::GetTime(this_00);
        if (lVar1 <= time_ns) {
          j = lVar2 + 1;
          lVar2 = k_1;
        }
        k_1 = lVar2;
        if (k_1 < j) {
          __assert_fail("i <= j",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xc84,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
        }
      }
      if (j != k_1) {
        __assert_fail("i == j",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc87,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
      if (j < 1) {
        __assert_fail("i > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc88,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
      if (this->m_clusterCount < j) {
        __assert_fail("i <= m_clusterCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc89,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
      this_local = (Segment *)this->m_clusters[j + -1];
      if (this_local == (Segment *)0x0) {
        __assert_fail("pCluster",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc8e,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
      if (this_local->m_start != j + -1) {
        __assert_fail("pCluster->m_index == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc8f,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
      lVar1 = Cluster::GetTime((Cluster *)this_local);
      if (time_ns < lVar1) {
        __assert_fail("pCluster->GetTime() <= time_ns",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc90,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
    }
  }
  return (Cluster *)this_local;
}

Assistant:

const Cluster* Segment::FindCluster(long long time_ns) const {
  if ((m_clusters == NULL) || (m_clusterCount <= 0))
    return &m_eos;

  {
    Cluster* const pCluster = m_clusters[0];
    assert(pCluster);
    assert(pCluster->m_index == 0);

    if (time_ns <= pCluster->GetTime())
      return pCluster;
  }

  // Binary search of cluster array

  long i = 0;
  long j = m_clusterCount;

  while (i < j) {
    // INVARIANT:
    //[0, i) <= time_ns
    //[i, j) ?
    //[j, m_clusterCount)  > time_ns

    const long k = i + (j - i) / 2;
    assert(k < m_clusterCount);

    Cluster* const pCluster = m_clusters[k];
    assert(pCluster);
    assert(pCluster->m_index == k);

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      i = k + 1;
    else
      j = k;

    assert(i <= j);
  }

  assert(i == j);
  assert(i > 0);
  assert(i <= m_clusterCount);

  const long k = i - 1;

  Cluster* const pCluster = m_clusters[k];
  assert(pCluster);
  assert(pCluster->m_index == k);
  assert(pCluster->GetTime() <= time_ns);

  return pCluster;
}